

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

lys_module *
moveto_resolve_model
          (char *mod_name_ns,uint16_t mod_nam_ns_len,ly_ctx *ctx,lys_node *cur_snode,int is_name,
          int import_and_disabled_model)

{
  byte bVar1;
  uint uVar2;
  lys_module *plVar3;
  char *pcVar4;
  lys_import *plVar5;
  int iVar6;
  uint uVar7;
  lys_module *plVar8;
  lys_module **pplVar9;
  ulong __n;
  uint uVar10;
  long lVar11;
  
  __n = (ulong)mod_nam_ns_len;
  if (cur_snode != (lys_node *)0x0) {
    bVar1 = (ctx->models).parsing_sub_modules_count;
    if (bVar1 == 0) {
      pplVar9 = &cur_snode->module;
    }
    else {
      pplVar9 = (ctx->models).parsing_sub_modules + (bVar1 - 1);
    }
    plVar3 = *pplVar9;
    plVar8 = lys_main_module(plVar3);
    pcVar4 = plVar8->name;
    iVar6 = strncmp(pcVar4,mod_name_ns,__n);
    if ((iVar6 == 0) && (pcVar4[__n] == '\0')) {
      return plVar8;
    }
    bVar1 = plVar3->imp_size;
    if ((ulong)bVar1 != 0) {
      plVar5 = plVar3->imp;
      lVar11 = 0;
      do {
        plVar3 = *(lys_module **)(plVar5->rev + lVar11 + -0x10);
        pcVar4 = plVar3->name;
        iVar6 = strncmp(pcVar4,mod_name_ns,__n);
        if ((iVar6 == 0) && (pcVar4[__n] == '\0')) {
          return plVar3;
        }
        lVar11 = lVar11 + 0x38;
      } while ((ulong)bVar1 * 0x38 - lVar11 != 0);
    }
  }
  uVar2 = (ctx->models).used;
  if (0 < (int)uVar2) {
    pplVar9 = (ctx->models).list;
    uVar10 = 1;
    do {
      plVar3 = pplVar9[uVar10 - 1 & 0xffff];
      if ((is_name != 0) || ((*(ushort *)&plVar3->field_0x40 & 0xc0) == 0x80)) {
        pcVar4 = plVar3->name;
        iVar6 = strncmp(pcVar4,mod_name_ns,__n);
        if ((iVar6 == 0) && (pcVar4[__n] == '\0')) {
          return plVar3;
        }
      }
      uVar7 = uVar10 & 0xffff;
      uVar10 = uVar10 + 1;
    } while (uVar7 < uVar2);
  }
  return (lys_module *)0x0;
}

Assistant:

static struct lys_module *
moveto_resolve_model(const char *mod_name_ns, uint16_t mod_nam_ns_len, struct ly_ctx *ctx, struct lys_node *cur_snode,
                     int is_name, int import_and_disabled_model)
{
    uint16_t i;
    const char *str;
    struct lys_module *mod, *mainmod;

    if (cur_snode) {
        /* detect if the XPath is used in augment - in such a case the module of the context node (cur_snode)
         * differs from the currently processed module. Then, we have to use the currently processed module
         * for searching for the module/namespace instead of the module of the context node */
        if (ctx->models.parsing_sub_modules_count &&
                cur_snode->module != ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1]) {
            mod = ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1];
        } else {
            mod = cur_snode->module;
        }
        mainmod = lys_main_module(mod);

        str = (is_name ? mainmod->name : mainmod->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return mainmod;
        }

        for (i = 0; i < mod->imp_size; ++i) {
            str = (is_name ? mod->imp[i].module->name : mod->imp[i].module->ns);
            if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
                return mod->imp[i].module;
            }
        }
    }

    for (i = 0; i < ctx->models.used; ++i) {
        if (!import_and_disabled_model && (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled)) {
            /* skip not implemented or disabled modules */
            continue;
        }
        str = (is_name ? ctx->models.list[i]->name : ctx->models.list[i]->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return ctx->models.list[i];
        }
    }

    return NULL;
}